

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# erfunc.c
# Opt level: O2

double erf__(double x)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar4 = ABS(x);
  if (dVar4 <= 0.5) {
    dVar4 = x * x;
    dVar4 = (((((dVar4 * 7.7105849500132e-05 + -0.00133733772997339) * dVar4 + 0.0323076579225834) *
               dVar4 + 0.0479137145607681) * dVar4 + 0.128379167095513 + 1.0) /
            (((dVar4 * 0.00301048631703895 + 0.0538971687740286) * dVar4 + 0.375795757275549) *
             dVar4 + 1.0)) * x;
  }
  else {
    if (dVar4 <= 4.0) {
      dVar3 = exp(-x * x);
      dVar3 = (dVar3 * (((((((dVar4 * -1.36864857382717e-07 + 0.564195517478974) * dVar4 +
                            7.21175825088309) * dVar4 + 43.1622272220567) * dVar4 + 152.98928504694)
                          * dVar4 + 339.320816734344) * dVar4 + 451.918953711873) * dVar4 +
                       300.459261020162)) /
              (((((((dVar4 + 12.7827273196294) * dVar4 + 77.0001529352295) * dVar4 +
                  277.585444743988) * dVar4 + 638.980264465631) * dVar4 + 931.35409485061) * dVar4 +
               790.950925327898) * dVar4 + 300.459260956983);
      bVar1 = x < -x;
    }
    else {
      if (5.8 <= dVar4) {
        return *(double *)(&DAT_00150610 + (ulong)(0.0 < x) * 8);
      }
      dVar2 = x * x;
      dVar5 = 1.0 / dVar2;
      dVar3 = exp(-dVar2);
      dVar3 = dVar3 * ((0.564189583547756 -
                       ((((dVar5 * 2.10144126479064 + 26.2370141675169) * dVar5 + 21.3688200555087)
                         * dVar5 + 4.6580782871847) * dVar5 + 0.282094791773523) /
                       (((((dVar5 * 94.153775055546 + 187.11481179959) * dVar5 + 99.0191814623914) *
                          dVar5 + 18.0124575948747) * dVar5 + 1.0) * dVar2)) / dVar4);
      bVar1 = x < 0.0;
    }
    dVar4 = (0.5 - dVar3) + 0.5;
    dVar4 = (double)(-(ulong)bVar1 & (ulong)-dVar4 | ~-(ulong)bVar1 & (ulong)dVar4);
  }
  return dVar4;
}

Assistant:

double erf__(double x)
{
/* -----------------------------------------------------------------------
 *             EVALUATION OF THE REAL ERROR FUNCTION
 * ----------------------------------------------------------------------- */

    /* Initialized data */

     double c = .564189583547756;
     double a[5] = { 7.7105849500132e-5,-.00133733772997339,
	    .0323076579225834,.0479137145607681,.128379167095513 };
     double b[3] = { .00301048631703895,.0538971687740286,
	    .375795757275549 };
     double p[8] = { -1.36864857382717e-7,.564195517478974,
	    7.21175825088309,43.1622272220567,152.98928504694,
	    339.320816734344,451.918953711873,300.459261020162 };
     double q[8] = { 1.,12.7827273196294,77.0001529352295,
	    277.585444743988,638.980264465631,931.35409485061,
	    790.950925327898,300.459260956983 };
     double r[5] = { 2.10144126479064,26.2370141675169,
	    21.3688200555087,4.6580782871847,.282094791773523 };
     double s[4] = { 94.153775055546,187.11481179959,
	    99.0191814623914,18.0124575948747 };

    /* System generated locals */
    double ret_val;

    /* Local variables */
    double t, x2, ax, bot, top;

    ax = fabs(x);
    if (ax <= 0.5) {
	t = x * x;
	top = (((a[0] * t + a[1]) * t + a[2]) * t + a[3]) * t + a[4] + 1.0;
	bot = ((b[0] * t + b[1]) * t + b[2]) * t + 1.0;

	return x * (top / bot);
    }
    /* else: ax > 0.5 */

    if (ax <= 4.) { /*  ax in (0.5, 4] */

	top = ((((((p[0] * ax + p[1]) * ax + p[2]) * ax + p[3]) * ax + p[4]) * ax
		+ p[5]) * ax + p[6]) * ax + p[7];
	bot = ((((((q[0] * ax + q[1]) * ax + q[2]) * ax + q[3]) * ax + q[4]) * ax
		+ q[5]) * ax + q[6]) * ax + q[7];
	ret_val = 0.5 - exp(-x * x) * top / bot + 0.5;
	if (x < 0.0) {
	    ret_val = -ret_val;
	}
	return ret_val;
    }

    /* else: ax > 4 */

    if (ax >= 5.8) {
	return x > 0 ? 1 : -1;
    }
    x2 = x * x;
    t = 1.0 / x2;
    top = (((r[0] * t + r[1]) * t + r[2]) * t + r[3]) * t + r[4];
    bot = (((s[0] * t + s[1]) * t + s[2]) * t + s[3]) * t + 1.0;
    t = (c - top / (x2 * bot)) / ax;
    ret_val = 0.5 - exp(-x2) * t + 0.5;
    if (x < 0.0) {
	ret_val = -ret_val;
    }
    return ret_val;

}